

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O0

ssize_t Omega_h::gmsh::read(int __fd,void *__buf,size_t __nbytes)

{
  I32 IVar1;
  element_type *peVar2;
  Library *library_in;
  undefined4 in_register_0000003c;
  Mesh *this;
  CommPtr *comm_local;
  istream *stream_local;
  Mesh *mesh;
  
  this = (Mesh *)CONCAT44(in_register_0000003c,__fd);
  peVar2 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)__nbytes);
  library_in = Comm::library(peVar2);
  Omega_h::Mesh::Mesh(this,library_in);
  peVar2 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)__nbytes);
  IVar1 = Comm::rank(peVar2);
  if (IVar1 == 0) {
    anon_unknown_0::read_internal((istream *)__buf,this);
  }
  Omega_h::Mesh::set_comm(this,(CommPtr *)__nbytes);
  Omega_h::Mesh::balance(this,false);
  return (ssize_t)this;
}

Assistant:

Mesh read(std::istream& stream, CommPtr comm) {
  auto mesh = Mesh(comm->library());
  if (comm->rank() == 0) {
    read_internal(stream, &mesh);
  }
  mesh.set_comm(comm);
  mesh.balance();
  return mesh;
}